

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_TestShell::createTest
          (TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_TestShell *this)

{
  TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test *this_00;
  TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_TestShell *this_local;
  
  this_00 = (TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test *)
            operator_new(0x80,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
                         ,0x69);
  TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test::
  TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockPlugin, installComparatorRecordsTheComparatorButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyComparator comparator;
    plugin.installComparator("myType", comparator);
    mock().expectOneCall("foo").withParameterOfType("myType", "name", NULLPTR);
    mock().actualCall("foo").withParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCompareCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}